

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

Curl_easy * gethandleathead(curl_llist *pipeline)

{
  curl_llist_element *curr;
  curl_llist *pipeline_local;
  
  if (pipeline->head == (curl_llist_element *)0x0) {
    pipeline_local = (curl_llist *)0x0;
  }
  else {
    pipeline_local = (curl_llist *)pipeline->head->ptr;
  }
  return (Curl_easy *)pipeline_local;
}

Assistant:

static struct Curl_easy* gethandleathead(struct curl_llist *pipeline)
{
  struct curl_llist_element *curr = pipeline->head;
#ifdef DEBUGBUILD
  {
    struct curl_llist_element *p = pipeline->head;
    while(p) {
      struct Curl_easy *e = p->ptr;
      DEBUGASSERT(GOOD_EASY_HANDLE(e));
      p = p->next;
    }
  }
#endif
  if(curr) {
    return (struct Curl_easy *) curr->ptr;
  }

  return NULL;
}